

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_all.cc
# Opt level: O2

int X509_verify(X509 *a,EVP_PKEY *r)

{
  int iVar1;
  
  iVar1 = X509_ALGOR_cmp(a->sig_alg,a->cert_info->signature);
  if (iVar1 != 0) {
    ERR_put_error(0xb,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_all.cc"
                  ,0x21);
    return 0;
  }
  iVar1 = ASN1_item_verify((ASN1_ITEM *)&X509_CINF_it,a->sig_alg,a->signature,a->cert_info,r);
  return iVar1;
}

Assistant:

int X509_verify(X509 *x509, EVP_PKEY *pkey) {
  if (X509_ALGOR_cmp(x509->sig_alg, x509->cert_info->signature)) {
    OPENSSL_PUT_ERROR(X509, X509_R_SIGNATURE_ALGORITHM_MISMATCH);
    return 0;
  }
  return ASN1_item_verify(ASN1_ITEM_rptr(X509_CINF), x509->sig_alg,
                          x509->signature, x509->cert_info, pkey);
}